

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O3

string_t duckdb::SubstringSlice(Vector *result,char *input_data,int64_t offset,int64_t length)

{
  ulong uVar1;
  undefined1 *__dest;
  string_t sVar2;
  string_t result_string;
  undefined1 local_30 [16];
  
  local_30 = (undefined1  [16])
             StringVector::EmptyString((StringVector *)result,(Vector *)length,offset);
  __dest = local_30._8_8_;
  if (local_30._0_4_ < 0xd) {
    __dest = local_30 + 4;
  }
  switchD_012b9b0d::default(__dest,input_data + offset,length);
  uVar1 = (ulong)(uint)local_30._0_4_;
  if (uVar1 < 0xd) {
    switchD_012e3010::default(local_30 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_30._4_4_ = *(undefined4 *)local_30._8_8_;
  }
  sVar2.value.pointer.ptr = (char *)local_30._8_8_;
  sVar2.value._0_8_ = local_30._0_8_;
  return (string_t)sVar2.value;
}

Assistant:

string_t SubstringSlice(Vector &result, const char *input_data, int64_t offset, int64_t length) {
	auto result_string = StringVector::EmptyString(result, UnsafeNumericCast<idx_t>(length));
	auto result_data = result_string.GetDataWriteable();
	memcpy(result_data, input_data + offset, UnsafeNumericCast<size_t>(length));
	result_string.Finalize();
	return result_string;
}